

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ImporterTest_Import_Test::~ImporterTest_Import_Test
          (ImporterTest_Import_Test *this)

{
  (this->super_ImporterTest).super_Test._vptr_Test = (_func_int **)&PTR__ImporterTest_018d65d0;
  Importer::~Importer(&(this->super_ImporterTest).importer_);
  (this->super_ImporterTest).source_tree_.super_SourceTree._vptr_SourceTree =
       (_func_int **)&PTR__MockSourceTree_018d6658;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                   *)&(this->super_ImporterTest).source_tree_.files_);
  SourceTree::~SourceTree(&(this->super_ImporterTest).source_tree_.super_SourceTree);
  MockErrorCollector::~MockErrorCollector(&(this->super_ImporterTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x170);
  return;
}

Assistant:

TEST_F(ImporterTest, Import) {
  // Test normal importing.
  AddFile("foo.proto",
          "syntax = \"proto2\";\n"
          "message Foo {}\n");

  const FileDescriptor* file = importer_.Import("foo.proto");
  EXPECT_EQ("", error_collector_.text_);
  ASSERT_TRUE(file != nullptr);

  ASSERT_EQ(1, file->message_type_count());
  EXPECT_EQ("Foo", file->message_type(0)->name());

  // Importing again should return same object.
  EXPECT_EQ(file, importer_.Import("foo.proto"));
}